

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O0

void __thiscall icu_63::number::Scale::Scale(Scale *this,int32_t magnitude,DecNum *arbitraryToAdopt)

{
  DecNum *this_00;
  bool bVar1;
  decNumber *pdVar2;
  undefined4 in_register_00000034;
  DecNum *arbitraryToAdopt_local;
  int32_t magnitude_local;
  Scale *this_local;
  
  this->fMagnitude = magnitude;
  this->fArbitrary = arbitraryToAdopt;
  this->fError = U_ZERO_ERROR;
  if (this->fArbitrary != (DecNum *)0x0) {
    impl::DecNum::normalize(this->fArbitrary);
    pdVar2 = impl::DecNum::getRawDecNumber(this->fArbitrary);
    if (((pdVar2->digits == 1) &&
        (pdVar2 = impl::DecNum::getRawDecNumber(this->fArbitrary), pdVar2->lsu[0] == '\x01')) &&
       (bVar1 = impl::DecNum::isNegative(this->fArbitrary), !bVar1)) {
      pdVar2 = impl::DecNum::getRawDecNumber(this->fArbitrary);
      this->fMagnitude = pdVar2->exponent + this->fMagnitude;
      this_00 = this->fArbitrary;
      if (this_00 != (DecNum *)0x0) {
        impl::DecNum::~DecNum(this_00);
        UMemory::operator_delete
                  ((UMemory *)this_00,(void *)CONCAT44(in_register_00000034,magnitude));
      }
      this->fArbitrary = (DecNum *)0x0;
    }
  }
  return;
}

Assistant:

Scale::Scale(int32_t magnitude, DecNum* arbitraryToAdopt)
        : fMagnitude(magnitude), fArbitrary(arbitraryToAdopt), fError(U_ZERO_ERROR) {
    if (fArbitrary != nullptr) {
        // Attempt to convert the DecNum to a magnitude multiplier.
        fArbitrary->normalize();
        if (fArbitrary->getRawDecNumber()->digits == 1 && fArbitrary->getRawDecNumber()->lsu[0] == 1 &&
            !fArbitrary->isNegative()) {
            // Success!
            fMagnitude += fArbitrary->getRawDecNumber()->exponent;
            delete fArbitrary;
            fArbitrary = nullptr;
        }
    }
}